

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O1

int Gia_ManSimulateWordsInit(Gia_Man_t *p,Vec_Wrd_t *vSimsIn)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  
  iVar12 = p->vCis->nSize;
  iVar2 = vSimsIn->nSize / iVar12;
  if (vSimsIn->nSize != iVar12 * iVar2) {
    __assert_fail("Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x75,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
  }
  if (p->vSims != (Vec_Wrd_t *)0x0) {
    pwVar5 = p->vSims->pArray;
    if (pwVar5 != (word *)0x0) {
      free(pwVar5);
      p->vSims->pArray = (word *)0x0;
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      free(p->vSims);
      p->vSims = (Vec_Wrd_t *)0x0;
    }
  }
  lVar8 = (long)iVar2;
  lVar13 = p->nObjs * lVar8;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar12 = (int)lVar13;
  iVar11 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar11 = iVar12;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar11;
  if (iVar11 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar11 << 3);
  }
  pVVar4->pArray = pwVar5;
  pVVar4->nSize = iVar12;
  memset(pwVar5,0,lVar13 * 8);
  p->vSims = pVVar4;
  p->nSimWords = iVar2;
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    lVar13 = 0;
    do {
      iVar12 = pVVar6->pArray[lVar10];
      if ((iVar12 < 0) || (p->nObjs <= iVar12)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar12 == 0) break;
      uVar3 = iVar12 * iVar2;
      if (((((int)uVar3 < 0) || (p->vSims->nSize <= (int)uVar3)) || (lVar13 < 0)) ||
         ((long)vSimsIn->nSize <= (lVar13 + lVar8) - lVar8)) goto LAB_0073fb30;
      lVar10 = lVar10 + 1;
      memcpy(p->vSims->pArray + uVar3,vSimsIn->pArray + lVar13,lVar8 * 8);
      pVVar6 = p->vCis;
      lVar13 = lVar13 + lVar8;
    } while (lVar10 < pVVar6->nSize);
  }
  if (1 < p->nObjs) {
    lVar8 = 1;
    do {
      uVar3 = (uint)*(ulong *)(p->pObjs + lVar8);
      uVar7 = *(ulong *)(p->pObjs + lVar8) & 0x1fffffff;
      iVar12 = (int)lVar8;
      if (uVar7 == 0x1fffffff || (int)uVar3 < 0) {
        if ((~uVar3 & 0x9fffffff) != 0) {
          if ((-1 < (int)uVar3) || ((int)uVar7 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                          ,0x86,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
          }
          uVar1 = p->nSimWords;
          if ((int)(iVar12 * uVar1) < 0) {
LAB_0073fb30:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          iVar2 = p->vSims->nSize;
          if (iVar2 <= (int)(iVar12 * uVar1)) goto LAB_0073fb30;
          uVar9 = uVar3 & 0x1fffffff;
          iVar11 = (iVar12 - uVar9) * uVar1;
          if ((iVar11 < 0) || (iVar2 <= iVar11)) goto LAB_0073fb30;
          pwVar5 = p->vSims->pArray;
          if ((uVar3 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar7 = 0;
              do {
                pwVar5[uVar1 * iVar12 + uVar7] = pwVar5[(iVar12 - uVar9) * uVar1 + uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar1 != uVar7);
            }
          }
          else if (0 < (int)uVar1) {
            uVar7 = 0;
            do {
              pwVar5[uVar1 * iVar12 + uVar7] = ~pwVar5[(iVar12 - uVar9) * uVar1 + uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
          }
        }
      }
      else {
        Gia_ManObjSimAnd(p,iVar12);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWordsInit( Gia_Man_t * p, Vec_Wrd_t * vSimsIn )
{
    Gia_Obj_t * pObj; int i, Id;
    int nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    assert( Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p) );
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // set input sim info
    Gia_ManForEachCiId( p, Id, i )
        memcpy( Vec_WrdEntryP(p->vSims, Id*nWords), Vec_WrdEntryP(vSimsIn, i*nWords), sizeof(word)*nWords );
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            continue;
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}